

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O2

void test_2d_static<0ul,0ul,30ul,30ul>(void)

{
  long lVar1;
  unsigned_long *puVar2;
  int j;
  long lVar3;
  int j_1;
  int j_2;
  unsigned_long *local_e68;
  size_t true_idx;
  unsigned_long *local_e58;
  int *local_e50;
  int dptr [900];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  puVar2 = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",puVar2,&true_idx);
  for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
    local_e58 = puVar2;
    for (lVar1 = 0; lVar1 != 900; lVar1 = lVar1 + 0x1e) {
      local_e68 = (unsigned_long *)(lVar1 + lVar3);
      true_idx = (size_t)local_e68;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e68,&true_idx);
      local_e50 = dptr + true_idx;
      local_e68 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e68,&local_e50);
      *(undefined4 *)puVar2 = 0x2a;
      local_e68 = (unsigned_long *)CONCAT44(local_e68._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",(int *)puVar2,
                 (int *)&local_e68);
      puVar2 = puVar2 + 0xf;
    }
    puVar2 = (unsigned_long *)((long)local_e58 + 4);
  }
  puVar2 = (unsigned_long *)dptr;
  for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
    local_e58 = puVar2;
    for (lVar1 = 0; lVar1 != 900; lVar1 = lVar1 + 0x1e) {
      local_e68 = (unsigned_long *)(lVar3 + lVar1);
      true_idx = (size_t)local_e68;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e68,&true_idx);
      local_e50 = dptr + true_idx;
      local_e68 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e68,&local_e50);
      puVar2 = puVar2 + 0xf;
    }
    puVar2 = (unsigned_long *)((long)local_e58 + 4);
  }
  puVar2 = (unsigned_long *)dptr;
  for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
    local_e58 = puVar2;
    for (lVar1 = 0; lVar1 != 900; lVar1 = lVar1 + 0x1e) {
      local_e68 = (unsigned_long *)(lVar3 + lVar1);
      true_idx = (size_t)local_e68;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x57,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e68,&true_idx);
      local_e50 = dptr + true_idx;
      local_e68 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x59,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e68,&local_e50);
      local_e68 = (unsigned_long *)CONCAT44(local_e68._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x6a,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",(int *)puVar2,
                 (int *)&local_e68);
      puVar2 = puVar2 + 0xf;
    }
    puVar2 = (unsigned_long *)((long)local_e58 + 4);
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}